

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O3

double __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::gted
          (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
           *this,TreeIndexAPTED *t1,int t1_current_subtree,TreeIndexAPTED *t2,int t2_current_subtree
          )

{
  pointer pvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  pointer piVar6;
  TreeIndexAPTED *pTVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  ulong uVar13;
  double dVar14;
  
  iVar9 = (t1->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_start[t1_current_subtree];
  iVar4 = (t2->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_start[t2_current_subtree];
  if (iVar4 == 1 || iVar9 == 1) {
    dVar14 = spf1(this,t1,t1_current_subtree,t2,t2_current_subtree);
    return dVar14;
  }
  pdVar5 = data_structures::Matrix<double>::read_at
                     (&this->delta_,(long)t1_current_subtree,(long)t2_current_subtree);
  iVar3 = (int)*pdVar5;
  iVar2 = -iVar3;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  iVar8 = iVar2 + -1;
  uVar10 = (t1->super_Constants).tree_size_;
  if ((int)uVar10 < iVar2) {
    if (iVar3 < 0) {
      iVar4 = 0;
    }
    else {
      uVar11 = 0;
      if ((int)uVar10 < iVar3) {
        uVar11 = uVar10;
      }
      iVar4 = ((uVar11 - iVar3) + iVar4 + t2_current_subtree != 0) + 1;
    }
    piVar6 = (t2->super_PreLToParent).prel_to_parent_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar9 = iVar8 - uVar10;
    for (iVar3 = piVar6[(int)(iVar8 - uVar10)]; t2_current_subtree <= iVar3; iVar3 = piVar6[iVar3])
    {
      pvVar1 = (t2->super_PreLToChildren).prel_to_children_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = (uint)((ulong)((long)*(pointer *)
                                     ((long)&pvVar1[iVar3].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                     8) -
                             *(long *)&pvVar1[iVar3].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl) >> 2);
      if (0 < (int)uVar11) {
        uVar13 = 0;
        do {
          iVar8 = *(int *)(*(long *)&pvVar1[iVar3].super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl + uVar13 * 4);
          if (iVar8 != iVar9) {
            gted(this,t1,t1_current_subtree,t2,iVar8);
          }
          uVar13 = uVar13 + 1;
        } while ((uVar11 & 0x7fffffff) != uVar13);
        piVar6 = (t2->super_PreLToParent).prel_to_parent_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
      }
      iVar9 = iVar3;
    }
    if (iVar4 == 1) {
      bVar12 = true;
      pTVar7 = t1;
      iVar9 = t2_current_subtree;
LAB_0011a0cb:
      dVar14 = spfR(this,t2,iVar9,pTVar7,t1_current_subtree,bVar12);
      return dVar14;
    }
    if (iVar4 != 0) {
      iVar8 = iVar2 + ~uVar10;
      bVar12 = true;
      pTVar7 = t1;
      iVar9 = t2_current_subtree;
LAB_0011a10a:
      dVar14 = spfA(this,t2,iVar9,pTVar7,t1_current_subtree,iVar8,iVar4,bVar12);
      return dVar14;
    }
    bVar12 = true;
    pTVar7 = t1;
    iVar9 = t2_current_subtree;
  }
  else {
    iVar4 = 0;
    if (-1 < iVar3) {
      iVar4 = (iVar9 + t1_current_subtree != iVar3) + 1;
    }
    piVar6 = (t1->super_PreLToParent).prel_to_parent_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar9 = iVar8;
    for (iVar2 = piVar6[iVar8]; t1_current_subtree <= iVar2; iVar2 = piVar6[iVar2]) {
      pvVar1 = (t1->super_PreLToChildren).prel_to_children_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = (uint)((ulong)((long)*(pointer *)
                                     ((long)&pvVar1[iVar2].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                     8) -
                             *(long *)&pvVar1[iVar2].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl) >> 2);
      if (0 < (int)uVar10) {
        uVar13 = 0;
        do {
          iVar3 = *(int *)(*(long *)&pvVar1[iVar2].super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl + uVar13 * 4);
          if (iVar3 != iVar9) {
            gted(this,t1,iVar3,t2,t2_current_subtree);
          }
          uVar13 = uVar13 + 1;
        } while ((uVar10 & 0x7fffffff) != uVar13);
        piVar6 = (t1->super_PreLToParent).prel_to_parent_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
      }
      iVar9 = iVar2;
    }
    if (iVar4 == 1) {
      bVar12 = false;
      pTVar7 = t2;
      t2 = t1;
      iVar9 = t1_current_subtree;
      t1_current_subtree = t2_current_subtree;
      goto LAB_0011a0cb;
    }
    if (iVar4 != 0) {
      bVar12 = false;
      pTVar7 = t2;
      t2 = t1;
      iVar9 = t1_current_subtree;
      t1_current_subtree = t2_current_subtree;
      goto LAB_0011a10a;
    }
    bVar12 = false;
    pTVar7 = t2;
    t2 = t1;
    iVar9 = t1_current_subtree;
    t1_current_subtree = t2_current_subtree;
  }
  dVar14 = spfL(this,t2,iVar9,pTVar7,t1_current_subtree,bVar12);
  return dVar14;
}

Assistant:

double APTEDTreeIndex<CostModel, TreeIndex>::gted(const TreeIndex& t1,
    int t1_current_subtree, const TreeIndex& t2,
    int t2_current_subtree) {
  const int currentSubtree1 = t1_current_subtree;
  const int currentSubtree2 = t2_current_subtree;
  const int subtreeSize1 = t1.prel_to_size_[currentSubtree1];
  const int subtreeSize2 = t2.prel_to_size_[currentSubtree2];

  // std::cout << "gted(" << currentSubtree1 << "," << currentSubtree2 << ")" << std::endl;

  double result = 0;

  // Use spf1.
  if ((subtreeSize1 == 1 || subtreeSize2 == 1)) {
    result = spf1(t1, currentSubtree1, t2, currentSubtree2);
    // std::cerr << "spf1(" << currentSubtree1 << "," << currentSubtree2 << ") = " << result << std::endl;
    return result;
  }

  int strategyPathID = static_cast<int>(delta_.read_at(currentSubtree1, currentSubtree2));

  int strategyPathType = -1;
  int currentPathNode = std::abs(strategyPathID) - 1;
  int pathIDOffset = t1.tree_size_;

  int parent = -1;
  if(currentPathNode < pathIDOffset) {
    strategyPathType = get_strategy_path_type(strategyPathID, pathIDOffset, currentSubtree1, subtreeSize1);
    parent = t1.prel_to_parent_[currentPathNode];
    while(parent >= currentSubtree1) {
      auto& ai = t1.prel_to_children_[parent];
      int k = ai.size();
      for(int i = 0; i < k; ++i) {
        int child = ai[i];
        if(child != currentPathNode) {
          // t1.set_current_node(child);
          gted(t1, child, t2, t2_current_subtree);
        }
      }
      currentPathNode = parent;
      parent = t1.prel_to_parent_[currentPathNode];
    }
    // TODO: Move this property away from node indexer and pass directly to spfs.
    // t1.set_current_node(currentSubtree1);

    // Pass to spfs a boolean that says says if the order of input subtrees
    // has been swapped compared to the order of the initial input trees.
    // Used for accessing delta array and deciding on the edit operation
    // [1, Section 3.4].
    if (strategyPathType == 0) {
      result = spfL(t1, t1_current_subtree, t2, t2_current_subtree, false);
      // std::cerr << "spfL(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
      return result;
    }
    if (strategyPathType == 1) {
      result = spfR(t1, t1_current_subtree, t2, t2_current_subtree, false);
      // std::cerr << "spfR(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
      return result;
    }
    result = spfA(t1, t1_current_subtree, t2, t2_current_subtree,
        std::abs(strategyPathID) - 1, strategyPathType, false);
    // std::cerr << "spfA(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
    return result;
  }

  currentPathNode -= pathIDOffset;
  strategyPathType = get_strategy_path_type(strategyPathID, pathIDOffset, currentSubtree2, subtreeSize2);
  parent = t2.prel_to_parent_[currentPathNode];
  while(parent >= currentSubtree2) {
    // std::cerr << "parent = " << parent << std::endl;
    // std::cerr << "# parent's children = " << t2.prel_to_children_[parent].size() << std::endl;
    auto& ai1 = t2.prel_to_children_[parent];
    int l = ai1.size();
    for(int j = 0; j < l; ++j) {
      int child = ai1[j];
      if(child != currentPathNode) {
        // t2.set_current_node(child);
        gted(t1, t1_current_subtree, t2, child);
      }
    }
    currentPathNode = parent;
    parent = t2.prel_to_parent_[currentPathNode];
  }
  // TODO: Move this property away from node indexer and pass directly to spfs.
  // t2.set_current_node(currentSubtree2);

  // Pass to spfs a boolean that says says if the order of input subtrees
  // has been swapped compared to the order of the initial input trees. Used
  // for accessing delta array and deciding on the edit operation
  // [1, Section 3.4].
  if (strategyPathType == 0) {
    result = spfL(t2, t2_current_subtree, t1, t1_current_subtree, true);
    // std::cerr << "spfL(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
    return result;
  }
  if (strategyPathType == 1) {
    result = spfR(t2, t2_current_subtree, t1, t1_current_subtree, true);
    // std::cerr << "spfR(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
    return result;
  }
  result = spfA(t2, t2_current_subtree, t1, t1_current_subtree,
      std::abs(strategyPathID) - pathIDOffset - 1, strategyPathType, true);
  // std::cerr << "spfA(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
  return result;
}